

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

int av1_calc_iframe_target_size_one_pass_cbr(AV1_COMP *cpi)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  int64_t target;
  double dVar8;
  
  if ((cpi->common).current_frame.frame_number == 0) {
    lVar4 = (cpi->ppi->p_rc).starting_buffer_level;
    target = 0x7fffffff;
    if (lVar4 < 0x100000000) {
      target = (int64_t)(int)(lVar4 / 2);
    }
    uVar3 = (cpi->svc).number_temporal_layers;
    if ((1 < (int)uVar3) && (target < 0x1fffffff)) {
      bVar7 = 2;
      if (uVar3 < 4) {
        bVar7 = (char)uVar3 - 1;
      }
      target = target << (bVar7 & 0x3f);
    }
  }
  else {
    dVar1 = cpi->framerate;
    dVar8 = round(dVar1 + dVar1 + -16.0);
    iVar6 = 0x20;
    if (0x20 < (int)dVar8) {
      iVar6 = (int)dVar8;
    }
    iVar2 = (cpi->rc).frames_since_key;
    iVar5 = (int)((double)(iVar2 * iVar6) / (dVar1 * 0.5));
    if (dVar1 * 0.5 <= (double)iVar2) {
      iVar5 = iVar6;
    }
    target = (long)(cpi->rc).avg_frame_bandwidth * (long)(iVar5 + 0x10) >> 4;
  }
  iVar6 = clamp_iframe_target_size(cpi,target);
  return iVar6;
}

Assistant:

int av1_calc_iframe_target_size_one_pass_cbr(const AV1_COMP *cpi) {
  const RATE_CONTROL *rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *p_rc = &cpi->ppi->p_rc;
  int64_t target;
  if (cpi->common.current_frame.frame_number == 0) {
    target = ((p_rc->starting_buffer_level / 2) > INT_MAX)
                 ? INT_MAX
                 : (int)(p_rc->starting_buffer_level / 2);
    if (cpi->svc.number_temporal_layers > 1 && target < (INT_MAX >> 2)) {
      target = target << AOMMIN(2, (cpi->svc.number_temporal_layers - 1));
    }
  } else {
    int kf_boost = 32;
    double framerate = cpi->framerate;

    kf_boost = AOMMAX(kf_boost, (int)round(2 * framerate - 16));
    if (rc->frames_since_key < framerate / 2) {
      kf_boost = (int)(kf_boost * rc->frames_since_key / (framerate / 2));
    }
    target = ((int64_t)(16 + kf_boost) * rc->avg_frame_bandwidth) >> 4;
  }
  return clamp_iframe_target_size(cpi, target);
}